

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmBlock * GetLoopContinueBlock(VmModule *module,uint depth)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (module->loopInfo).count;
  uVar2 = uVar1;
  if (depth != 0) {
    uVar3 = 0;
    do {
      do {
        uVar2 = uVar2 - 1;
        if (uVar1 <= uVar2) goto LAB_001b4364;
      } while ((module->loopInfo).data[uVar2].continueBlock == (VmBlock *)0x0);
      uVar3 = uVar3 + 1;
    } while (uVar3 != depth);
  }
  if (uVar2 < uVar1) {
    return (module->loopInfo).data[uVar2].continueBlock;
  }
LAB_001b4364:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,
                "T &SmallArray<VmModule::LoopInfo, 32>::operator[](unsigned int) [T = VmModule::LoopInfo, N = 32]"
               );
}

Assistant:

VmBlock* GetLoopContinueBlock(VmModule *module, unsigned depth)
{
	unsigned pos = module->loopInfo.size();

	for(unsigned i = 0; i < depth; i++)
	{
		pos--;

		while(!module->loopInfo[pos].continueBlock)
			pos--;
	}

	return module->loopInfo[pos].continueBlock;
}